

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O1

int __thiscall
IfNeuron::addStimulus(IfNeuron *this,StochasticVariable *stochvar,double weight,double revPot)

{
  int iVar1;
  VoltageDependance *this_00;
  string local_80;
  double local_60;
  double local_58;
  string local_50;
  
  local_60 = weight;
  local_58 = revPot;
  this_00 = (VoltageDependance *)operator_new(0x160);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"channel","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Weighted Difference","");
  VoltageDependance::VoltageDependance(this_00,local_60,local_58,&local_80,&local_50);
  iVar1 = DifferentialEquation::addTerm
                    (&this->ifneuronMembrane,(StochasticFunction *)this_00,stochvar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int IfNeuron::addStimulus( StochasticVariable *stochvar, double weight, double revPot )
{
	return ifneuronMembrane.addTerm( new VoltageDependance(weight, revPot, "channel"), stochvar );
}